

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devexpricing.hpp
# Opt level: O2

HighsInt __thiscall DevexPricing::chooseconstrainttodrop(DevexPricing *this,QpVector *lambda)

{
  double *pdVar1;
  double dVar2;
  BasisStatus BVar3;
  HighsInt HVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  double dVar7;
  double local_78;
  vector<int,_std::allocator<int>_> active_constraint_index;
  vector<int,_std::allocator<int>_> constraintindexinbasisfactor;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&active_constraint_index,&this->basis->active_constraint_index);
  std::vector<int,_std::allocator<int>_>::vector
            (&constraintindexinbasisfactor,&this->basis->constraintindexinbasisfactor);
  HVar4 = -1;
  uVar5 = 0;
  local_78 = 0.0;
  do {
    if ((ulong)((long)active_constraint_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)active_constraint_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= uVar5) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&constraintindexinbasisfactor.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&active_constraint_index.super__Vector_base<int,_std::allocator<int>_>);
      return HVar4;
    }
    lVar6 = (long)constraintindexinbasisfactor.super__Vector_base<int,_std::allocator<int>_>._M_impl
                  .super__Vector_impl_data._M_start
                  [active_constraint_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar5]];
    if (lVar6 == -1) {
      puts("error");
    }
    dVar2 = (lambda->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar6];
    dVar7 = (dVar2 * dVar2) /
            (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar6];
    if ((local_78 < dVar7) &&
       (pdVar1 = &(this->runtime->settings).lambda_zero_threshold,
       *pdVar1 <= ABS(dVar2) && ABS(dVar2) != *pdVar1)) {
      BVar3 = Basis::getstatus(this->basis,
                               active_constraint_index.super__Vector_base<int,_std::allocator<int>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar5]);
      if ((BVar3 != kActiveAtLower) ||
         (pdVar1 = (lambda->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar6, 0.0 < *pdVar1 || *pdVar1 == 0.0)) {
        BVar3 = Basis::getstatus(this->basis,
                                 active_constraint_index.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar5]);
        if ((BVar3 != kActiveAtUpper) ||
           ((lambda->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar6] <= 0.0)) goto LAB_0032787c;
      }
      HVar4 = active_constraint_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      local_78 = dVar7;
    }
LAB_0032787c:
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

HighsInt chooseconstrainttodrop(const QpVector& lambda) {
    auto active_constraint_index = basis.getactive();
    auto constraintindexinbasisfactor = basis.getindexinfactor();

    HighsInt minidx = -1;
    double maxabslambda = 0.0;
    for (size_t i = 0; i < active_constraint_index.size(); i++) {
      HighsInt indexinbasis =
          constraintindexinbasisfactor[active_constraint_index[i]];
      if (indexinbasis == -1) {
        printf("error\n");
      }
      assert(indexinbasis != -1);

      double val = lambda.value[indexinbasis] * lambda.value[indexinbasis] /
                   weights[indexinbasis];
      if (val > maxabslambda && fabs(lambda.value[indexinbasis]) >
                                    runtime.settings.lambda_zero_threshold) {
        if (basis.getstatus(active_constraint_index[i]) ==
                BasisStatus::kActiveAtLower &&
            -lambda.value[indexinbasis] > 0) {
          minidx = active_constraint_index[i];
          maxabslambda = val;
        } else if (basis.getstatus(active_constraint_index[i]) ==
                       BasisStatus::kActiveAtUpper &&
                   lambda.value[indexinbasis] > 0) {
          minidx = active_constraint_index[i];
          maxabslambda = val;
        } else {
          // TODO
        }
      }
    }

    return minidx;
  }